

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase916::run(TestCase916 *this)

{
  EventLoop *pEVar1;
  Promise<capnproto_test::capnp::test::TestCallOrder::Client> *promise;
  PromiseFulfiller<capnproto_test::capnp::test::TestCallOrder::Client> *this_00;
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> *pRVar2;
  socklen_t in_ECX;
  undefined4 in_register_0000000c;
  void *__buf;
  void *__buf_00;
  int in_R8D;
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> local_528;
  Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> local_4f0;
  Type local_4a9;
  undefined1 local_4a8 [8];
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> call5;
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> call4;
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> call3;
  undefined1 local_3c0 [8];
  Client resolved;
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> call2;
  undefined1 local_330 [8];
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> call1;
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> call0;
  Client pipeline;
  RemotePromise<capnproto_test::capnp::test::TestMoreStuff::EchoResults> echo;
  undefined1 local_258 [8];
  Request<capnproto_test::capnp::test::TestMoreStuff::EchoParams,_capnproto_test::capnp::test::TestMoreStuff::EchoResults>
  echoRequest;
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  local_208;
  undefined1 local_1d0 [8];
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> earlyCall;
  Client cap;
  PromiseFulfillerPair<capnproto_test::capnp::test::TestCallOrder::Client> paf;
  undefined1 local_150 [16];
  undefined1 local_140 [8];
  Client client;
  TestContext context;
  TestCase916 *this_local;
  
  context.rpcServer.super_RpcSystemBase.impl.ptr = (Impl *)this;
  TestContext::TestContext((TestContext *)&client.field_0x10);
  TestContext::connect((TestContext *)local_150,(int)&client.field_0x10,(sockaddr *)0x5,in_ECX);
  Capability::Client::castAs<capnproto_test::capnp::test::TestMoreStuff>
            ((Client *)local_140,(Client *)local_150);
  Capability::Client::~Client((Client *)local_150);
  kj::newPromiseAndFulfiller<capnproto_test::capnp::test::TestCallOrder::Client>();
  promise = kj::mv<kj::Promise<capnproto_test::capnp::test::TestCallOrder::Client>>
                      ((Promise<capnproto_test::capnp::test::TestCallOrder::Client> *)
                       &cap.field_0x10);
  capnproto_test::capnp::test::TestCallOrder::Client::
  Client<capnproto_test::capnp::test::TestCallOrder::Client,void>
            ((Client *)&earlyCall.super_Pipeline._typeless.ops.disposer,promise);
  pEVar1 = ((Event *)((long)local_140 + -0x28))->loop;
  kj::Maybe<capnp::MessageSize>::Maybe
            ((Maybe<capnp::MessageSize> *)&echoRequest.hook.ptr,(void *)0x0);
  capnproto_test::capnp::test::TestCallOrder::Client::getCallSequenceRequest
            (&local_208,(Client *)(local_140 + (long)pEVar1),
             (Maybe<capnp::MessageSize> *)&echoRequest.hook.ptr);
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  ::send((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
          *)local_1d0,(int)&local_208,__buf,CONCAT44(in_register_0000000c,in_ECX),in_R8D);
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  ::~Request(&local_208);
  kj::Maybe<capnp::MessageSize>::~Maybe((Maybe<capnp::MessageSize> *)&echoRequest.hook.ptr);
  kj::Maybe<capnp::MessageSize>::Maybe
            ((Maybe<capnp::MessageSize> *)&echo.super_Pipeline._typeless.ops.disposer,(void *)0x0);
  capnproto_test::capnp::test::TestMoreStuff::Client::echoRequest
            ((Request<capnproto_test::capnp::test::TestMoreStuff::EchoParams,_capnproto_test::capnp::test::TestMoreStuff::EchoResults>
              *)local_258,(Client *)local_140,
             (Maybe<capnp::MessageSize> *)&echo.super_Pipeline._typeless.ops.disposer);
  kj::Maybe<capnp::MessageSize>::~Maybe
            ((Maybe<capnp::MessageSize> *)&echo.super_Pipeline._typeless.ops.disposer);
  capnproto_test::capnp::test::TestMoreStuff::EchoParams::Builder::setCap
            ((Builder *)local_258,(Client *)&earlyCall.super_Pipeline._typeless.ops.disposer);
  Request<capnproto_test::capnp::test::TestMoreStuff::EchoParams,_capnproto_test::capnp::test::TestMoreStuff::EchoResults>
  ::send((Request<capnproto_test::capnp::test::TestMoreStuff::EchoParams,_capnproto_test::capnp::test::TestMoreStuff::EchoResults>
          *)&pipeline.field_0x10,(int)local_258,__buf_00,CONCAT44(in_register_0000000c,in_ECX),
         in_R8D);
  capnproto_test::capnp::test::TestMoreStuff::EchoResults::Pipeline::getCap
            ((Client *)&call0.super_Pipeline._typeless.ops.disposer,
             (Pipeline *)
             &echo.
              super_Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::EchoResults>_>
              .super_PromiseBase.node.ptr);
  getCallSequence((RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
                   *)&call1.super_Pipeline._typeless.ops.disposer,
                  (Client *)&call0.super_Pipeline._typeless.ops.disposer,0);
  getCallSequence((RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
                   *)local_330,(Client *)&call0.super_Pipeline._typeless.ops.disposer,1);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
  ::wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)&call2.super_Pipeline._typeless.ops.disposer,local_1d0);
  Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::~Response
            ((Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> *)
             &call2.super_Pipeline._typeless.ops.disposer);
  getCallSequence((RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
                   *)&resolved.field_0x10,(Client *)&call0.super_Pipeline._typeless.ops.disposer,2);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::EchoResults>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::EchoResults>_> *)
             &call3.super_Pipeline._typeless.ops.disposer,&pipeline.field_0x10);
  capnproto_test::capnp::test::TestMoreStuff::EchoResults::Reader::getCap
            ((Client *)local_3c0,(Reader *)&call3.super_Pipeline._typeless.ops.disposer);
  Response<capnproto_test::capnp::test::TestMoreStuff::EchoResults>::~Response
            ((Response<capnproto_test::capnp::test::TestMoreStuff::EchoResults> *)
             &call3.super_Pipeline._typeless.ops.disposer);
  getCallSequence((RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
                   *)&call4.super_Pipeline._typeless.ops.disposer,
                  (Client *)&call0.super_Pipeline._typeless.ops.disposer,3);
  getCallSequence((RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
                   *)&call5.super_Pipeline._typeless.ops.disposer,
                  (Client *)&call0.super_Pipeline._typeless.ops.disposer,4);
  getCallSequence((RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
                   *)local_4a8,(Client *)&call0.super_Pipeline._typeless.ops.disposer,5);
  this_00 = kj::Own<kj::PromiseFulfiller<capnproto_test::capnp::test::TestCallOrder::Client>_>::
            operator->((Own<kj::PromiseFulfiller<capnproto_test::capnp::test::TestCallOrder::Client>_>
                        *)&paf.promise.super_PromiseBase.node.ptr);
  kj::PromiseFulfiller<capnproto_test::capnp::test::TestCallOrder::Client>::
  rejectIfThrows<capnp::_::(anonymous_namespace)::TestCase916::run()::__0>(this_00,&local_4a9);
  pRVar2 = kj::
           mv<capnp::RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>>
                     ((RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
                       *)&call1.super_Pipeline._typeless.ops.disposer);
  (anonymous_namespace)::
  expectPromiseThrows<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>>
            (&pRVar2->
              super_Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
             ,(WaitScope *)&context.loop.daemons.ptr);
  pRVar2 = kj::
           mv<capnp::RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>>
                     ((RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
                       *)local_330);
  (anonymous_namespace)::
  expectPromiseThrows<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>>
            (&pRVar2->
              super_Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
             ,(WaitScope *)&context.loop.daemons.ptr);
  pRVar2 = kj::
           mv<capnp::RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>>
                     ((RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
                       *)&resolved.field_0x10);
  (anonymous_namespace)::
  expectPromiseThrows<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>>
            (&pRVar2->
              super_Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
             ,(WaitScope *)&context.loop.daemons.ptr);
  pRVar2 = kj::
           mv<capnp::RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>>
                     ((RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
                       *)&call4.super_Pipeline._typeless.ops.disposer);
  (anonymous_namespace)::
  expectPromiseThrows<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>>
            (&pRVar2->
              super_Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
             ,(WaitScope *)&context.loop.daemons.ptr);
  pRVar2 = kj::
           mv<capnp::RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>>
                     ((RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
                       *)&call5.super_Pipeline._typeless.ops.disposer);
  (anonymous_namespace)::
  expectPromiseThrows<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>>
            (&pRVar2->
              super_Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
             ,(WaitScope *)&context.loop.daemons.ptr);
  pRVar2 = kj::
           mv<capnp::RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>>
                     ((RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
                       *)local_4a8);
  (anonymous_namespace)::
  expectPromiseThrows<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>>
            (&pRVar2->
              super_Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
             ,(WaitScope *)&context.loop.daemons.ptr);
  getCallSequence(&local_528,
                  (Client *)(local_140 + (long)((Event *)((long)local_140 + -0x28))->loop),1);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
  ::wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)&local_4f0,&local_528);
  Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::~Response
            (&local_4f0);
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::~RemotePromise
            (&local_528);
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> *)
             local_4a8);
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> *)
             &call5.super_Pipeline._typeless.ops.disposer);
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> *)
             &call4.super_Pipeline._typeless.ops.disposer);
  capnproto_test::capnp::test::TestCallOrder::Client::~Client((Client *)local_3c0);
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> *)
             &resolved.field_0x10);
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> *)
             local_330);
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> *)
             &call1.super_Pipeline._typeless.ops.disposer);
  capnproto_test::capnp::test::TestCallOrder::Client::~Client
            ((Client *)&call0.super_Pipeline._typeless.ops.disposer);
  RemotePromise<capnproto_test::capnp::test::TestMoreStuff::EchoResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestMoreStuff::EchoResults> *)
             &pipeline.field_0x10);
  Request<capnproto_test::capnp::test::TestMoreStuff::EchoParams,_capnproto_test::capnp::test::TestMoreStuff::EchoResults>
  ::~Request((Request<capnproto_test::capnp::test::TestMoreStuff::EchoParams,_capnproto_test::capnp::test::TestMoreStuff::EchoResults>
              *)local_258);
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> *)
             local_1d0);
  capnproto_test::capnp::test::TestCallOrder::Client::~Client
            ((Client *)&earlyCall.super_Pipeline._typeless.ops.disposer);
  kj::PromiseFulfillerPair<capnproto_test::capnp::test::TestCallOrder::Client>::
  ~PromiseFulfillerPair
            ((PromiseFulfillerPair<capnproto_test::capnp::test::TestCallOrder::Client> *)
             &cap.field_0x10);
  capnproto_test::capnp::test::TestMoreStuff::Client::~Client((Client *)local_140);
  TestContext::~TestContext((TestContext *)&client.field_0x10);
  return;
}

Assistant:

TEST(Rpc, EmbargoError) {
  TestContext context;

  auto client = context.connect(test::TestSturdyRefObjectId::Tag::TEST_MORE_STUFF)
      .castAs<test::TestMoreStuff>();

  auto paf = kj::newPromiseAndFulfiller<test::TestCallOrder::Client>();

  auto cap = test::TestCallOrder::Client(kj::mv(paf.promise));

  auto earlyCall = client.getCallSequenceRequest().send();

  auto echoRequest = client.echoRequest();
  echoRequest.setCap(cap);
  auto echo = echoRequest.send();

  auto pipeline = echo.getCap();

  auto call0 = getCallSequence(pipeline, 0);
  auto call1 = getCallSequence(pipeline, 1);

  earlyCall.wait(context.waitScope);

  auto call2 = getCallSequence(pipeline, 2);

  auto resolved = echo.wait(context.waitScope).getCap();

  auto call3 = getCallSequence(pipeline, 3);
  auto call4 = getCallSequence(pipeline, 4);
  auto call5 = getCallSequence(pipeline, 5);

  paf.fulfiller->rejectIfThrows([]() { KJ_FAIL_ASSERT("foo") { break; } });

  expectPromiseThrows(kj::mv(call0), context.waitScope);
  expectPromiseThrows(kj::mv(call1), context.waitScope);
  expectPromiseThrows(kj::mv(call2), context.waitScope);
  expectPromiseThrows(kj::mv(call3), context.waitScope);
  expectPromiseThrows(kj::mv(call4), context.waitScope);
  expectPromiseThrows(kj::mv(call5), context.waitScope);

  // Verify that we're still connected (there were no protocol errors).
  getCallSequence(client, 1).wait(context.waitScope);
}